

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O1

int big_block_read(BigBlock *bb,BigBlockPtr *ptr,BigArray *array)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  uint uVar5;
  void *buf;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  FILE *__stream;
  size_t sVar9;
  int *piVar10;
  char *pcVar11;
  ulong __size;
  uint uVar12;
  ulong __n;
  size_t dims [2];
  BigArray chunk_array;
  BigArrayIter array_iter;
  BigArrayIter chunk_iter;
  ulong local_498;
  long local_490;
  BigArray local_480;
  BigArrayIter local_260;
  BigArrayIter local_148;
  
  sVar3 = CHUNK_BYTES;
  buf = malloc(CHUNK_BYTES);
  uVar5 = bb->nmemb;
  local_490 = (long)(int)uVar5;
  uVar12 = 1;
  if (1 < uVar5) {
    uVar12 = uVar5;
  }
  _dtype_normalize((char *)&local_480,bb->dtype);
  iVar4 = atoi((char *)((long)&local_480.ndim + 2));
  __size = (ulong)(int)(iVar4 * uVar12);
  uVar6 = sVar3 / __size;
  memset(&local_480,0,0x220);
  local_498 = uVar6;
  if (buf == (void *)0x0) {
    _big_file_raise("Not enough memory for chunkbuf",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x333);
  }
  else {
    big_array_init(&local_480,buf,bb->dtype,2,&local_498,(ptrdiff_t *)0x0);
    big_array_iter_init(&local_260,array);
    uVar7 = array->size / (ulong)(long)(int)uVar12;
    if (bb->size < bb->foffset[ptr->fileid] + uVar7 + ptr->roffset) {
      _big_file_raise("Reading beyond the block `%s` at (%d:%td)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x33e,bb->basename,(long)ptr->fileid,ptr->roffset * __size);
    }
    else {
      __stream = (FILE *)0x0;
      do {
        if ((long)uVar7 < 1) {
LAB_0010518e:
          free(buf);
          return 0;
        }
        uVar5 = ptr->fileid;
        lVar1 = ptr->roffset;
        if (bb->size <= bb->foffset[(int)uVar5] + lVar1) goto LAB_0010518e;
        uVar8 = bb->fsize[(int)uVar5] - lVar1;
        if (uVar6 < uVar8) {
          uVar8 = uVar6;
        }
        __n = uVar7;
        if (uVar8 < uVar7) {
          __n = uVar8;
        }
        if (uVar8 == 0) {
          _big_file_raise("Insufficient number of items in file `%s\' at (%d:%td)",
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,0x34d,bb->basename,(ulong)uVar5,lVar1 * __size);
          uVar5 = 6;
        }
        else {
          big_array_iter_init(&local_148,&local_480);
          __stream = (FILE *)_big_file_open_a_file(bb->basename,uVar5,"r",1);
          if (__stream == (FILE *)0x0) {
            _big_file_raise((char *)0x0,
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x355);
            uVar5 = 7;
            goto LAB_0010504b;
          }
          iVar4 = fseek(__stream,ptr->roffset * __size,0);
          if (iVar4 < 0) {
            pcVar2 = bb->basename;
            uVar5 = ptr->fileid;
            lVar1 = ptr->roffset;
            piVar10 = __errno_location();
            pcVar11 = strerror(*piVar10);
            _big_file_raise("Failed to seek in block `%s\' at (%d:%td) (%s)",
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x359,pcVar2,(ulong)uVar5,lVar1 * __size,pcVar11);
            uVar5 = 8;
          }
          else {
            sVar9 = fread(buf,__size,__n,__stream);
            if (__n == sVar9) {
              fclose(__stream);
              iVar4 = _dtype_convert(&local_260,&local_148,(long)bb->nmemb * __n);
              if (iVar4 == 0) {
                uVar7 = uVar7 - __n;
                iVar4 = big_block_seek(bb,ptr,__n + bb->foffset[ptr->fileid] + ptr->roffset);
                if (iVar4 == 0) {
                  __stream = (FILE *)0x0;
                  uVar5 = 0;
                  goto LAB_001050f6;
                }
                _big_file_raise((char *)0x0,
                                "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                                ,0x368);
                uVar5 = 0xb;
              }
              else {
                _big_file_raise((char *)0x0,
                                "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                                ,0x363);
                uVar5 = 10;
              }
LAB_0010504b:
              __stream = (FILE *)0x0;
            }
            else {
              pcVar2 = bb->basename;
              uVar5 = ptr->fileid;
              lVar1 = ptr->roffset;
              piVar10 = __errno_location();
              pcVar11 = strerror(*piVar10);
              _big_file_raise("Failed to read in block `%s\' at (%d:%td) (%s)",
                              "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                              ,0x35d,pcVar2,(ulong)uVar5,lVar1 * __size,pcVar11);
              uVar5 = 9;
            }
          }
        }
LAB_001050f6:
      } while (uVar5 == 0);
      if (0xb < uVar5) {
        return uVar5;
      }
      if ((0xcc0U >> uVar5 & 1) == 0) {
        if ((0x300U >> uVar5 & 1) == 0) {
          return uVar5;
        }
        fclose(__stream);
      }
    }
    free(buf);
  }
  return -1;
}

Assistant:

int
big_block_read(BigBlock * bb, BigBlockPtr * ptr, BigArray * array)
{
    char * chunkbuf = malloc(CHUNK_BYTES);

    int nmemb = bb->nmemb ? bb->nmemb : 1;
    int felsize = big_file_dtype_itemsize(bb->dtype) * nmemb;
    size_t CHUNK_SIZE = CHUNK_BYTES / felsize;

    BigArray chunk_array = {0};
    size_t dims[2];
    dims[0] = CHUNK_SIZE;
    dims[1] = bb->nmemb;

    BigArrayIter chunk_iter;
    BigArrayIter array_iter;

    FILE * fp = NULL;
    ptrdiff_t toread = 0;

    RAISEIF(chunkbuf == NULL,
            ex_malloc,
            "Not enough memory for chunkbuf");

    big_array_init(&chunk_array, chunkbuf, bb->dtype, 2, dims, NULL);
    big_array_iter_init(&array_iter, array);

    toread = array->size / nmemb;

    ptrdiff_t abs = bb->foffset[ptr->fileid] + ptr->roffset + toread;
    RAISEIF(abs > bb->size,
                ex_eof,
                "Reading beyond the block `%s` at (%d:%td)",
                bb->basename, ptr->fileid, ptr->roffset * felsize);

    while(toread > 0 && ! big_block_eof(bb, ptr)) {
        size_t chunk_size = CHUNK_SIZE;
        /* remaining items in the file */
        if(chunk_size > bb->fsize[ptr->fileid] - ptr->roffset) {
            chunk_size = bb->fsize[ptr->fileid] - ptr->roffset;
        }
        /* remaining items to read */
        if(chunk_size > toread) {
            chunk_size = toread;
        }
        RAISEIF(chunk_size == 0,
            ex_insuf,
            "Insufficient number of items in file `%s' at (%d:%td)",
            bb->basename, ptr->fileid, ptr->roffset * felsize);

        /* read to the beginning of chunk */
        big_array_iter_init(&chunk_iter, &chunk_array);

        fp = _big_file_open_a_file(bb->basename, ptr->fileid, "r", 1);
        RAISEIF(fp == NULL,
                ex_open,
                NULL);
        RAISEIF(0 > fseek(fp, ptr->roffset * felsize, SEEK_SET),
                ex_seek,
                "Failed to seek in block `%s' at (%d:%td) (%s)", 
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        RAISEIF(chunk_size != fread(chunkbuf, felsize, chunk_size, fp),
                ex_read,
                "Failed to read in block `%s' at (%d:%td) (%s)",
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        fclose(fp);
        fp = NULL;

        /* now translate the data from chunkbuf to mptr */
        RAISEIF(0 != _dtype_convert(&array_iter, &chunk_iter, chunk_size * bb->nmemb),
            ex_convert, NULL);

        toread -= chunk_size;
        RAISEIF(0 != big_block_seek_rel(bb, ptr, chunk_size),
                ex_blockseek,
                NULL);
    }

    free(chunkbuf);
    return 0;
ex_read:
ex_seek:
    fclose(fp);
ex_insuf:
ex_convert:
ex_blockseek:
ex_open:
ex_eof:
    free(chunkbuf);
ex_malloc:
    return -1;
}